

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O0

void RigidBodyDynamics::CalcPointJacobian
               (Model *model,VectorNd *Q,uint body_id,Vector3d *point_position,MatrixNd *G,
               bool update_kinematics)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  uint in_EDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  byte in_R9B;
  uint q_index;
  uint j;
  uint fbody_id;
  uint reference_body_id;
  SpatialTransform point_trans;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffffb68;
  MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *in_stack_fffffffffffffb70;
  Matrix3d *in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  uint in_stack_fffffffffffffb84;
  Model *in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  Index in_stack_fffffffffffffba0;
  Index in_stack_fffffffffffffba8;
  DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>
  *in_stack_fffffffffffffbb0;
  SpatialTransform *in_stack_fffffffffffffc08;
  SpatialTransform *in_stack_fffffffffffffc30;
  SpatialTransform *in_stack_fffffffffffffc38;
  SpatialVector *in_stack_fffffffffffffd30;
  SpatialTransform *in_stack_fffffffffffffd38;
  SpatialTransform *in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd7f;
  Vector3d *in_stack_fffffffffffffd80;
  uint in_stack_fffffffffffffd8c;
  VectorNd *in_stack_fffffffffffffd90;
  Model *in_stack_fffffffffffffd98;
  VectorNd *in_stack_fffffffffffffee8;
  VectorNd *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  value_type vVar5;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  
  if ((in_R9B & 1) != 0) {
    UpdateKinematicsCustom
              ((Model *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (VectorNd *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Matrix3_t::
  Matrix3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix3_t *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  CalcBodyToBaseCoordinates
            (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
             in_stack_fffffffffffffd80,(bool)in_stack_fffffffffffffd7f);
  Math::SpatialTransform::SpatialTransform
            ((SpatialTransform *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             in_stack_fffffffffffffb78,(Vector3d *)in_stack_fffffffffffffb70);
  vVar5 = in_EDX;
  bVar1 = Model::IsFixedBodyId(in_stack_fffffffffffffb88,in_stack_fffffffffffffb84);
  if (bVar1) {
    pvVar2 = std::
             vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ::operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                           *)(in_RDI + 0x1f),
                          (ulong)(in_EDX - *(int *)&in_RDI[0x20].
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start));
    vVar5 = pvVar2->mMovableParent;
  }
  while (vVar5 != 0) {
    std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
    operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                *)&in_RDI[6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage,(ulong)vVar5);
    pvVar3 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&in_RDI[6].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(ulong)vVar5);
    if (pvVar3->mDoFCount == 3) {
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)(in_RDI + 0x1e),(ulong)vVar5);
      Math::SpatialTransform::inverse(in_stack_fffffffffffffc08);
      Math::SpatialTransform::operator*(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
      Math::SpatialTransform::toMatrix(in_stack_fffffffffffffd60);
      std::
      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    *)&in_RDI[0xe].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)vVar5);
      Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                (in_stack_fffffffffffffb70,
                 (MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_fffffffffffffb68);
      Eigen::
      DenseBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,3,0,6,3>,0>>::
      block<int,int>(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                     in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffbb0,
                 in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
                 in_stack_fffffffffffffb98);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                 in_stack_fffffffffffffb70,
                 (DenseBase<Eigen::Block<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>,__1,__1,_false>_>
                  *)in_stack_fffffffffffffb68);
    }
    else {
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)(in_RDI + 0x1e),(ulong)vVar5);
      Math::SpatialTransform::inverse(in_stack_fffffffffffffc08);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)vVar5);
      Math::SpatialTransform::apply(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      Math::SpatialTransform::apply(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<int,int>
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffbb0,
                 in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
                 in_stack_fffffffffffffb98);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffbb0,
                 in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
                 in_stack_fffffffffffffb98);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                 in_stack_fffffffffffffb70,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_> *)
                 in_stack_fffffffffffffb68);
    }
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(ulong)vVar5);
    vVar5 = *pvVar4;
  }
  return;
}

Assistant:

RBDL_DLLAPI
void CalcPointJacobian (
		Model &model,
		const VectorNd &Q,
		unsigned int body_id,
		const Vector3d &point_position,
		MatrixNd &G,
		bool update_kinematics
	) {
	LOG << "-------- " << __func__ << " --------" << std::endl;

	// update the Kinematics if necessary
	if (update_kinematics) {
		UpdateKinematicsCustom (model, &Q, NULL, NULL);
	}

	SpatialTransform point_trans = SpatialTransform (Matrix3d::Identity(), CalcBodyToBaseCoordinates (model, Q, body_id, point_position, false));

	assert (G.rows() == 3 && G.cols() == model.qdot_size );

	unsigned int reference_body_id = body_id;

	if (model.IsFixedBodyId(body_id)) {
		unsigned int fbody_id = body_id - model.fixed_body_discriminator;
		reference_body_id = model.mFixedBodies[fbody_id].mMovableParent;
	}

	unsigned int j = reference_body_id;

	// e[j] is set to 1 if joint j contributes to the jacobian that we are
	// computing. For all other joints the column will be zero.
	while (j != 0) {
		unsigned int q_index = model.mJoints[j].q_index;

		if (model.mJoints[j].mDoFCount == 3) {
			G.block(0, q_index, 3, 3) = ((point_trans * model.X_base[j].inverse()).toMatrix() * model.multdof3_S[j]).block(3,0,3,3);
		} else {
			G.block(0,q_index, 3, 1) = point_trans.apply(model.X_base[j].inverse().apply(model.S[j])).block(3,0,3,1);
		}

		j = model.lambda[j];
	}
}